

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char>_>
fmt::v8::detail::copy_str<char,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char>_> out)

{
  back_insert_iterator<fmt::v8::detail::buffer<char>_> this;
  buffer<char> *in_RDX;
  long in_RSI;
  long in_RDI;
  value_type *in_stack_ffffffffffffffc8;
  long local_18;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_10 [2];
  
  local_18 = in_RDI;
  local_10[0].container = in_RDX;
  while (local_18 != in_RSI) {
    local_18 = local_18 + 1;
    this = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator++(local_10,0);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*
              ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)&stack0xffffffffffffffd0);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)this.container,
               in_stack_ffffffffffffffc8);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_10[0].container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}